

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

GLuint __thiscall
deqp::gls::LifetimeTests::details::ShaderProgramAttacher::getAttachment
          (ShaderProgramAttacher *this,GLuint program)

{
  int iVar1;
  int iVar2;
  Functions *pFVar3;
  GLint local_30;
  int local_2c;
  GLint shaderType;
  int ndx;
  GLuint ret;
  GLsizei numShaders;
  GLsizei shadersLen;
  GLuint shaders [2];
  GLuint program_local;
  ShaderProgramAttacher *this_local;
  
  shaders[0] = program;
  unique0x1000013f = this;
  memset(&numShaders,0,8);
  ret = 2;
  ndx = 0;
  shaderType = 0;
  pFVar3 = ContextWrapper::gl(&(this->super_Attacher).super_ContextWrapper);
  (*pFVar3->getAttachedShaders)(shaders[0],2,&ndx,(GLuint *)&numShaders);
  local_2c = 0;
  while( true ) {
    iVar1 = local_2c;
    iVar2 = de::min<int>(2,ndx);
    if (iVar2 <= iVar1) {
      return shaderType;
    }
    local_30 = 0;
    pFVar3 = ContextWrapper::gl(&(this->super_Attacher).super_ContextWrapper);
    (*pFVar3->getShaderiv)((&numShaders)[local_2c],0x8b4f,&local_30);
    if (local_30 == 0x8b30) break;
    local_2c = local_2c + 1;
  }
  return (&numShaders)[local_2c];
}

Assistant:

GLuint ShaderProgramAttacher::getAttachment (GLuint program)
{
	GLuint			shaders[2]	= { 0, 0 };
	const GLsizei	shadersLen	= DE_LENGTH_OF_ARRAY(shaders);
	GLsizei			numShaders	= 0;
	GLuint			ret			= 0;

	gl().getAttachedShaders(program, shadersLen, &numShaders, shaders);

	// There should ever be at most one attached shader in normal use, but if
	// something is wrong, the temporary vertex shader might not have been
	// detached properly, so let's find the fragment shader explicitly.
	for (int ndx = 0; ndx < de::min<GLsizei>(shadersLen, numShaders); ++ndx)
	{
		GLint shaderType = GL_NONE;
		gl().getShaderiv(shaders[ndx], GL_SHADER_TYPE, &shaderType);

		if (shaderType == GL_FRAGMENT_SHADER)
		{
			ret = shaders[ndx];
			break;
		}
	}

	return ret;
}